

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O0

void eraseAllTableMapElements<std::unordered_map<XrSpatialGraphNodeBindingMSFT_T*,XrGeneratedDispatchTable*,std::hash<XrSpatialGraphNodeBindingMSFT_T*>,std::equal_to<XrSpatialGraphNodeBindingMSFT_T*>,std::allocator<std::pair<XrSpatialGraphNodeBindingMSFT_T*const,XrGeneratedDispatchTable*>>>>
               (unordered_map<XrSpatialGraphNodeBindingMSFT_T_*,_XrGeneratedDispatchTable_*,_std::hash<XrSpatialGraphNodeBindingMSFT_T_*>,_std::equal_to<XrSpatialGraphNodeBindingMSFT_T_*>,_std::allocator<std::pair<XrSpatialGraphNodeBindingMSFT_T_*const,_XrGeneratedDispatchTable_*>_>_>
                *search_map,mutex *mutex,XrGeneratedDispatchTable *search_value)

{
  bool bVar1;
  pointer ppVar2;
  _Node_iterator<std::pair<XrSpatialGraphNodeBindingMSFT_T_*const,_XrGeneratedDispatchTable_*>,_false,_false>
  __position;
  _Node_iterator_base<std::pair<XrSpatialGraphNodeBindingMSFT_T_*const,_XrGeneratedDispatchTable_*>,_false>
  local_40;
  _Node_iterator_base<std::pair<XrSpatialGraphNodeBindingMSFT_T_*const,_XrGeneratedDispatchTable_*>,_false>
  local_38;
  iterator it;
  unique_lock<std::mutex> lock;
  XrGeneratedDispatchTable *search_value_local;
  mutex *mutex_local;
  unordered_map<XrSpatialGraphNodeBindingMSFT_T_*,_XrGeneratedDispatchTable_*,_std::hash<XrSpatialGraphNodeBindingMSFT_T_*>,_std::equal_to<XrSpatialGraphNodeBindingMSFT_T_*>,_std::allocator<std::pair<XrSpatialGraphNodeBindingMSFT_T_*const,_XrGeneratedDispatchTable_*>_>_>
  *search_map_local;
  
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)&it,mutex);
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<XrSpatialGraphNodeBindingMSFT_T_*,_XrGeneratedDispatchTable_*,_std::hash<XrSpatialGraphNodeBindingMSFT_T_*>,_std::equal_to<XrSpatialGraphNodeBindingMSFT_T_*>,_std::allocator<std::pair<XrSpatialGraphNodeBindingMSFT_T_*const,_XrGeneratedDispatchTable_*>_>_>
       ::begin(search_map);
  while( true ) {
    local_40._M_cur =
         (__node_type *)
         std::
         unordered_map<XrSpatialGraphNodeBindingMSFT_T_*,_XrGeneratedDispatchTable_*,_std::hash<XrSpatialGraphNodeBindingMSFT_T_*>,_std::equal_to<XrSpatialGraphNodeBindingMSFT_T_*>,_std::allocator<std::pair<XrSpatialGraphNodeBindingMSFT_T_*const,_XrGeneratedDispatchTable_*>_>_>
         ::end(search_map);
    bVar1 = std::__detail::operator!=(&local_38,&local_40);
    if (!bVar1) break;
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<XrSpatialGraphNodeBindingMSFT_T_*const,_XrGeneratedDispatchTable_*>,_false,_false>
             ::operator->((_Node_iterator<std::pair<XrSpatialGraphNodeBindingMSFT_T_*const,_XrGeneratedDispatchTable_*>,_false,_false>
                           *)&local_38);
    if (ppVar2->second == search_value) {
      __position = std::__detail::
                   _Node_iterator<std::pair<XrSpatialGraphNodeBindingMSFT_T_*const,_XrGeneratedDispatchTable_*>,_false,_false>
                   ::operator++((_Node_iterator<std::pair<XrSpatialGraphNodeBindingMSFT_T_*const,_XrGeneratedDispatchTable_*>,_false,_false>
                                 *)&local_38,0);
      std::
      unordered_map<XrSpatialGraphNodeBindingMSFT_T_*,_XrGeneratedDispatchTable_*,_std::hash<XrSpatialGraphNodeBindingMSFT_T_*>,_std::equal_to<XrSpatialGraphNodeBindingMSFT_T_*>,_std::allocator<std::pair<XrSpatialGraphNodeBindingMSFT_T_*const,_XrGeneratedDispatchTable_*>_>_>
      ::erase(search_map,
              (iterator)
              __position.
              super__Node_iterator_base<std::pair<XrSpatialGraphNodeBindingMSFT_T_*const,_XrGeneratedDispatchTable_*>,_false>
              ._M_cur);
    }
    else {
      std::__detail::
      _Node_iterator<std::pair<XrSpatialGraphNodeBindingMSFT_T_*const,_XrGeneratedDispatchTable_*>,_false,_false>
      ::operator++((_Node_iterator<std::pair<XrSpatialGraphNodeBindingMSFT_T_*const,_XrGeneratedDispatchTable_*>,_false,_false>
                    *)&local_38);
    }
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&it);
  return;
}

Assistant:

void eraseAllTableMapElements(MapType &search_map, std::mutex &mutex, XrGeneratedDispatchTable *search_value) {
    std::unique_lock<std::mutex> lock(mutex);
    for (auto it = search_map.begin(); it != search_map.end();) {
        if (it->second == search_value) {
            search_map.erase(it++);
        } else {
            ++it;
        }
    }
}